

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O3

void __thiscall
fill<64U,_42U,_buffer_layout_dfs>::operator()
          (fill<64U,_42U,_buffer_layout_dfs> *this,array<Stream,_64UL> *streams,uchar **buffer,
          array<unsigned_long,_64UL> *buffer_count)

{
  ulong n0;
  uchar *puVar1;
  int iVar2;
  ostream *poVar3;
  uchar *puVar4;
  long lVar5;
  uchar **ppuVar6;
  uchar **ppuVar7;
  uchar **ppuVar8;
  long lVar9;
  DI __d;
  size_t local_70;
  size_t local_68;
  DI local_38;
  
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"fill_leaf",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", leaf,  I=",0xb);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  local_38.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  if (buffer_count->_M_elems[0x2a] != 0) {
    __assert_fail("buffer_count[I] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x13b,
                  "void fill_leaf(std::array<Stream, K> &__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict, std::true_type) [K = 64U, I = 42U, BufferLayout = buffer_layout_dfs]"
                 );
  }
  local_68 = streams->_M_elems[0x14].n;
  local_70 = streams->_M_elems[0x15].n;
  n0 = local_70 + local_68;
  if (n0 < 0x17) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"need=",5);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Ln=",5);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Rn=",5);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    lVar9 = -n0;
    if (local_68 == 0) {
      lVar5 = 0x17;
LAB_001b5ee2:
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"left drained, Ln=",0x11);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Rn=",5);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if (local_70 != 0) {
        memcpy(buffer + lVar9 + (0x77a - lVar5),streams->_M_elems[0x15].stream,local_70 << 3);
      }
      streams->_M_elems[0x15].n = 0;
      buffer_count->_M_elems[0x2a] = n0;
    }
    else {
      if (local_70 != 0) {
        ppuVar7 = streams->_M_elems[0x14].stream;
        puVar4 = *ppuVar7;
        if (puVar4 != (uchar *)0x0) {
          ppuVar6 = streams->_M_elems[0x15].stream;
          ppuVar8 = buffer + lVar9 + 0x763;
          lVar5 = 0x16;
          do {
            puVar1 = *ppuVar6;
            if (puVar1 == (uchar *)0x0) goto LAB_001b617a;
            iVar2 = strcmp((char *)puVar4,(char *)puVar1);
            if (iVar2 < 1) {
              *ppuVar8 = puVar4;
              ppuVar7 = ppuVar7 + 1;
              streams->_M_elems[0x14].stream = ppuVar7;
              local_68 = local_68 - 1;
              streams->_M_elems[0x14].n = local_68;
              if (local_68 == 0) goto LAB_001b5ee2;
            }
            else {
              *ppuVar8 = puVar1;
              ppuVar6 = ppuVar6 + 1;
              streams->_M_elems[0x15].stream = ppuVar6;
              local_70 = local_70 - 1;
              streams->_M_elems[0x15].n = local_70;
              if (local_70 == 0) goto LAB_001b5dfe;
            }
            puVar4 = *ppuVar7;
            ppuVar8 = ppuVar8 + 1;
            lVar5 = lVar5 + -1;
          } while (puVar4 != (uchar *)0x0);
        }
LAB_001b5c2e:
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
      }
      lVar5 = 0x17;
LAB_001b5dfe:
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"right drained, Ln=",0x12);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Rn=",5);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if (local_68 != 0) {
        memcpy(buffer + lVar9 + 0x763 + (0x17 - lVar5),streams->_M_elems[0x14].stream,local_68 << 3)
        ;
      }
      streams->_M_elems[0x14].n = 0;
      buffer_count->_M_elems[0x2a] = n0;
      check_input(buffer + lVar9 + 0x763,n0);
    }
  }
  else {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"need=",5);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Ln=",5);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Rn=",5);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if (local_68 == 0) {
      lVar9 = 0x17;
LAB_001b608c:
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"left drained, Ln=",0x11);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Rn=",5);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      ppuVar7 = streams->_M_elems[0x15].stream;
      if (lVar9 != 0) {
        memcpy(buffer + (0x763 - lVar9),ppuVar7,lVar9 * 8);
      }
      streams->_M_elems[0x15].n = local_70 - lVar9;
      streams->_M_elems[0x15].stream = ppuVar7 + lVar9;
    }
    else if (local_70 == 0) {
      lVar9 = 0x17;
LAB_001b5fb5:
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"right drained, Ln=",0x12);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Rn=",5);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      ppuVar7 = streams->_M_elems[0x14].stream;
      if (lVar9 != 0) {
        memcpy(buffer + (0x763 - lVar9),ppuVar7,lVar9 * 8);
      }
      streams->_M_elems[0x14].n = local_68 - lVar9;
      streams->_M_elems[0x14].stream = ppuVar7 + lVar9;
    }
    else {
      ppuVar7 = streams->_M_elems[0x14].stream;
      ppuVar6 = streams->_M_elems[0x15].stream;
      lVar9 = 0;
      do {
        puVar4 = *ppuVar7;
        if (puVar4 == (uchar *)0x0) goto LAB_001b5c2e;
        puVar1 = *ppuVar6;
        if (puVar1 == (uchar *)0x0) {
LAB_001b617a:
          __assert_fail("b != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                        ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
        }
        iVar2 = strcmp((char *)puVar4,(char *)puVar1);
        if (iVar2 < 1) {
          buffer[lVar9 + 0x74c] = puVar4;
          ppuVar7 = ppuVar7 + 1;
          streams->_M_elems[0x14].stream = ppuVar7;
          local_68 = local_68 - 1;
          streams->_M_elems[0x14].n = local_68;
          if (local_68 == 0) {
            lVar9 = 0x16 - lVar9;
            goto LAB_001b608c;
          }
        }
        else {
          buffer[lVar9 + 0x74c] = puVar1;
          ppuVar6 = ppuVar6 + 1;
          streams->_M_elems[0x15].stream = ppuVar6;
          local_70 = local_70 - 1;
          streams->_M_elems[0x15].n = local_70;
          if (local_70 == 0) {
            lVar9 = 0x16 - lVar9;
            goto LAB_001b5fb5;
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x17);
    }
    buffer_count->_M_elems[0x2a] = 0x17;
    check_input(buffer + 0x74c,0x17);
  }
  anon_func::DI::~DI(&local_38);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}